

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_rel_exp(SyntaxAnalyze *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *in_RDI;
  SharedExNdPtr SVar6;
  string tmpName;
  Op op;
  SharedExNdPtr father;
  SharedExNdPtr second;
  SharedExNdPtr *first;
  element_type *in_stack_fffffffffffffe48;
  ExpressNode *in_stack_fffffffffffffe50;
  element_type *in_stack_fffffffffffffe58;
  SyntaxAnalyze *in_stack_fffffffffffffe60;
  undefined1 *in_stack_fffffffffffffe68;
  SyntaxAnalyze *in_stack_fffffffffffffe70;
  bool local_12a;
  undefined1 local_110 [32];
  undefined1 local_f0 [52];
  Op in_stack_ffffffffffffff44;
  SharedExNdPtr *in_stack_ffffffffffffff48;
  SharedExNdPtr *in_stack_ffffffffffffff50;
  __node_base in_stack_ffffffffffffff58;
  SyntaxAnalyze *in_stack_ffffffffffffff60;
  string local_90 [52];
  undefined4 local_5c;
  Token in_stack_ffffffffffffffbc;
  SyntaxAnalyze *in_stack_ffffffffffffffc0;
  TyKind in_stack_ffffffffffffffd4;
  SyntaxAnalyze *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2af897);
  gm_exp(in_stack_ffffffffffffffd8);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2af8d0);
  while( true ) {
    bVar3 = try_word(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (Token)in_stack_fffffffffffffe68,
                     (Token)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    local_12a = true;
    _Var5._M_pi = extraout_RDX;
    if (!bVar3) {
      local_12a = try_word(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                           ,(Token)in_stack_fffffffffffffe68,
                           (Token)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      _Var5._M_pi = extraout_RDX_00;
    }
    if (local_12a == false) break;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af95e);
    operator_new(0x48);
    express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffe70);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48);
    bVar3 = try_word(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     (Token)in_stack_fffffffffffffe58);
    if (bVar3) {
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2af9cf);
      peVar4->_operation = LSS;
      match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_5c = 7;
    }
    else {
      bVar3 = try_word(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                       (Token)in_stack_fffffffffffffe58);
      if (bVar3) {
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afaa4);
        peVar4->_operation = GRE;
        match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        local_5c = 6;
      }
      else {
        bVar3 = try_word(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                         (Token)in_stack_fffffffffffffe58);
        if (bVar3) {
          peVar4 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2afb03);
          peVar4->_operation = LEQ;
          match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          local_5c = 9;
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2afb38);
          peVar4->_operation = GEQ;
          match_one_word(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          local_5c = 8;
        }
      }
    }
    gm_exp(in_stack_ffffffffffffffd8);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2afb9b);
    peVar4 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2afba8);
    if ((peVar4->_type == CNS) &&
       (peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afbbe), peVar4->_type == CNS)) {
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2afbd9);
      peVar4->_type = CNS;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2afbe9);
      switch(peVar4->_operation) {
      case LSS:
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afc21);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afc35);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afc58);
        peVar4->_value = (uint)(iVar2 < iVar1);
        break;
      case LEQ:
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afc71);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afc85);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afca8);
        peVar4->_value = (uint)(iVar2 <= iVar1);
        break;
      case GEQ:
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afd0e);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afd22);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afd45);
        peVar4->_value = (uint)(iVar1 <= iVar2);
        break;
      case GRE:
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afcc1);
        iVar2 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afcd5);
        iVar1 = peVar4->_value;
        peVar4 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2afcf8);
        peVar4->_value = (uint)(iVar1 < iVar2);
      }
    }
    else {
      std::__cxx11::string::string(local_90);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      std::__cxx11::string::operator=(local_90,(string *)&stack0xffffffffffffff50);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2afdba);
      peVar4->_type = VAR;
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2afdca);
      std::__cxx11::string::operator=((string *)&peVar4->_name,local_90);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),local_90);
      in_stack_fffffffffffffe68 = local_f0 + 0x10;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe70 = (SyntaxAnalyze *)local_f0;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
      hp_gn_binary_mir(in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58._M_nxt,
                       in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44
                      );
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2afe5e);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2afe6b);
      std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      std::__cxx11::string::~string(local_90);
    }
    in_stack_fffffffffffffe58 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2afef7);
    in_stack_fffffffffffffe60 = (SyntaxAnalyze *)(local_110 + 0x10);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe50,(SharedExNdPtr *)in_stack_fffffffffffffe48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aff34);
    in_stack_fffffffffffffe48 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2aff41);
    in_stack_fffffffffffffe50 = (ExpressNode *)local_110;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe50,(SharedExNdPtr *)in_stack_fffffffffffffe48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aff7c);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aff9e);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2affab);
  }
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedExNdPtr)
         SVar6.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_rel_exp() {
  SharedExNdPtr first;
  first = gm_exp();

  while (try_word(1, Token::LSS, Token::GRE) ||
         try_word(1, Token::LEQ, Token::GEQ)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::LSS)) {
      father->_operation = OperationType::LSS;
      match_one_word(Token::LSS);
      op = Op::Lt;
    } else if (try_word(1, Token::GRE)) {
      father->_operation = OperationType::GRE;
      match_one_word(Token::GRE);
      op = Op::Gt;
    } else if (try_word(1, Token::LEQ)) {
      father->_operation = OperationType::LEQ;
      match_one_word(Token::LEQ);
      op = Op::Lte;
    } else {
      father->_operation = OperationType::GEQ;
      match_one_word(Token::GEQ);
      op = Op::Gte;
    }

    second = gm_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::LSS:
          father->_value = first->_value < second->_value;
          break;
        case OperationType::LEQ:
          father->_value = first->_value <= second->_value;
          break;
        case OperationType::GRE:
          father->_value = first->_value > second->_value;
          break;
        case OperationType::GEQ:
          father->_value = first->_value >= second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }

    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}